

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stair_shuffle.c
# Opt level: O3

void map_dungeon(dungeon_map *map,uint8_t x,uint8_t y,BOOL have_keys)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  undefined7 in_register_00000031;
  dungeon_map *pdVar6;
  byte bVar7;
  ulong uVar8;
  
  if (map == (dungeon_map *)0x0) {
    return;
  }
  uVar8 = CONCAT71(in_register_00000031,x) & 0xffffffff;
  bVar7 = (byte)uVar8;
  if (map->width <= bVar7) {
    return;
  }
LAB_00169419:
  if (map->height <= y) {
    return;
  }
  lVar3 = (ulong)(uint)((int)CONCAT71(in_register_00000031,x) << 5) + uVar8 * -2 + 3;
  bVar1 = *(byte *)((long)map + (ulong)y + lVar3);
  if ((bVar1 & 8) != 0) {
    return;
  }
  pbVar2 = (byte *)((long)map + (ulong)y + lVar3);
  if (bVar1 == 5) {
    if (have_keys == FALSE) {
      return;
    }
    *pbVar2 = 0xd;
  }
  else {
    if (bVar1 == 0) {
      return;
    }
    if (bVar1 == 6) {
      return;
    }
    *pbVar2 = bVar1 | 8;
    if (((bVar1 | 10) == 0xb) && (uVar5 = warps_to->map, uVar5 != '\0')) {
      lVar3 = 1;
      do {
        uVar4 = *(uint8_t *)((long)warps_from + lVar3 + -1);
        pdVar6 = maps;
        if (((uVar4 == map->index) && ((&warps_from->map)[lVar3] == bVar7)) &&
           ((&warps_from->x)[lVar3] == y)) {
          uVar4 = maps->index;
          goto LAB_00169527;
        }
        if (((uVar5 == map->index) && ((&warps_to->map)[lVar3] == bVar7)) &&
           ((&warps_to->x)[lVar3] == y)) {
          uVar5 = maps->index;
          goto LAB_00169548;
        }
        uVar5 = (&warps_to->y)[lVar3];
        lVar3 = lVar3 + 3;
      } while (uVar5 != '\0');
    }
  }
  goto LAB_001694d7;
LAB_00169527:
  if (uVar4 == '\0') goto LAB_00169560;
  if (uVar4 == uVar5) goto LAB_00169562;
  uVar4 = pdVar6[1].index;
  pdVar6 = pdVar6 + 1;
  goto LAB_00169527;
LAB_00169560:
  pdVar6 = (dungeon_map *)0x0;
LAB_00169562:
  uVar5 = (&warps_to->map)[lVar3];
  uVar4 = (&warps_to->x)[lVar3];
  goto LAB_00169578;
LAB_00169548:
  if (uVar5 == '\0') goto LAB_0016956d;
  if (uVar5 == uVar4) goto LAB_0016956f;
  uVar5 = pdVar6[1].index;
  pdVar6 = pdVar6 + 1;
  goto LAB_00169548;
LAB_0016956d:
  pdVar6 = (dungeon_map *)0x0;
LAB_0016956f:
  uVar5 = (&warps_from->map)[lVar3];
  uVar4 = (&warps_from->x)[lVar3];
LAB_00169578:
  map_dungeon(pdVar6,uVar5,uVar4,have_keys);
LAB_001694d7:
  map_dungeon(map,x + 0xff,y,have_keys);
  map_dungeon(map,x + '\x01',y,have_keys);
  map_dungeon(map,x,y - 1,have_keys);
  y = y + 1;
  if (map->width <= bVar7) {
    return;
  }
  goto LAB_00169419;
}

Assistant:

static void map_dungeon(dungeon_map *map, uint8_t x, uint8_t y, BOOL have_keys)
{
    dw_warp warp;

    if (!map)
        return;

    if (map_ob(map, x, y))
        return;

    if (map->tiles[x][y] & 0x8)
        return;

    if (!tile_is_walkable(map->tiles[x][y], have_keys))
        return;

    map->tiles[x][y] |= 0x8;
    if (map->tiles[x][y] == (DUNGEON_TILE_STAIRS_UP | 0x8) ||
        map->tiles[x][y] == (DUNGEON_TILE_STAIRS_DOWN | 0x8)) {
        follow_warp(map, x, y, have_keys);
    }
    map_dungeon(map, x-1, y, have_keys);
    map_dungeon(map, x+1, y, have_keys);
    map_dungeon(map, x, y-1, have_keys);
    map_dungeon(map, x, y+1, have_keys);


}